

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O2

intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_intersect_iterator<std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>,std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>&>
          (intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>
          *ranges)

{
  intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
  ::intersect_iterator(__return_storage_ptr__,*(undefined8 *)this,*(undefined8 *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

auto make_intersect_iterator (RandomAccessRange && ranges)
    {
        using std::begin;
        using std::end;
        return
            make_intersect_iterator
            (
                begin(std::forward<RandomAccessRange>(ranges)),
                end(std::forward<RandomAccessRange>(ranges))
            );
    }